

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O3

void PDHG_Compute_Residuals(CUPDLPwork *work)

{
  CUPDLPresobj *pCVar1;
  CUPDLPiterates *pCVar2;
  CUPDLPvec *pCVar3;
  CUPDLPvec *pCVar4;
  int iVar5;
  cupdlp_float *x;
  double dVar6;
  cupdlp_float *in_stack_ffffffffffffffc0;
  
  pCVar1 = work->resobj;
  pCVar2 = work->iterates;
  iVar5 = work->timers->nIter % 2;
  pCVar3 = pCVar2->y[iVar5];
  pCVar4 = pCVar2->aty[iVar5];
  x = pCVar2->x[iVar5]->data;
  PDHG_Compute_Primal_Feasibility
            (work,pCVar1->primalResidual,pCVar2->ax[iVar5]->data,x,&pCVar1->dPrimalFeas,
             &pCVar1->dPrimalObj);
  PDHG_Compute_Dual_Feasibility
            (work,pCVar1->dualResidual,pCVar4->data,x,pCVar3->data,&pCVar1->dDualFeas,
             &pCVar1->dDualObj,in_stack_ffffffffffffffc0,pCVar1->dSlackPos,pCVar1->dSlackNeg);
  PDHG_Compute_Primal_Feasibility
            (work,pCVar1->primalResidualAverage,pCVar2->axAverage->data,pCVar2->xAverage->data,
             &pCVar1->dPrimalFeasAverage,&pCVar1->dPrimalObjAverage);
  PDHG_Compute_Dual_Feasibility
            (work,pCVar1->dualResidualAverage,pCVar2->atyAverage->data,
             (cupdlp_float *)pCVar2->atyAverage,pCVar2->yAverage->data,&pCVar1->dDualFeasAverage,
             &pCVar1->dDualObjAverage,in_stack_ffffffffffffffc0,pCVar1->dSlackPosAverage,
             pCVar1->dSlackNegAverage);
  dVar6 = pCVar1->dPrimalObj - pCVar1->dDualObj;
  pCVar1->dDualityGap = dVar6;
  pCVar1->dRelObjGap = ABS(dVar6) / (ABS(pCVar1->dDualObj) + ABS(pCVar1->dPrimalObj) + 1.0);
  dVar6 = pCVar1->dPrimalObjAverage - pCVar1->dDualObjAverage;
  pCVar1->dDualityGapAverage = dVar6;
  pCVar1->dRelObjGapAverage =
       ABS(dVar6) / (ABS(pCVar1->dDualObjAverage) + ABS(pCVar1->dPrimalObjAverage) + 1.0);
  return;
}

Assistant:

void PDHG_Compute_Residuals(CUPDLPwork *work) {
#if problem_USE_TIMERS
  ++problem->nComputeResidualsCalls;
  double dStartTime = getTimeStamp();
#endif
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPresobj *resobj = work->resobj;
  CUPDLPiterates *iterates = work->iterates;
  CUPDLPscaling *scaling = work->scaling;
  CUPDLPsettings *settings = work->settings;

  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];


  PDHG_Compute_Primal_Feasibility(work, resobj->primalResidual,
                                  ax->data, x->data,
                                  &resobj->dPrimalFeas, &resobj->dPrimalObj);
  PDHG_Compute_Dual_Feasibility(
      work, resobj->dualResidual, aty->data, x->data,
      y->data, &resobj->dDualFeas, &resobj->dDualObj,
      &resobj->dComplementarity, resobj->dSlackPos, resobj->dSlackNeg);

  PDHG_Compute_Primal_Feasibility(
      work, resobj->primalResidualAverage, iterates->axAverage->data,
      iterates->xAverage->data, &resobj->dPrimalFeasAverage,
      &resobj->dPrimalObjAverage);
  PDHG_Compute_Dual_Feasibility(
      work, resobj->dualResidualAverage, iterates->atyAverage->data,
      iterates->xAverage->data, iterates->yAverage->data,
      &resobj->dDualFeasAverage, &resobj->dDualObjAverage,
      &resobj->dComplementarityAverage, resobj->dSlackPosAverage,
      resobj->dSlackNegAverage);

  // resobj->dPrimalObj /= (scaling->dObjScale * scaling->dObjScale);
  // resobj->dDualObj /= (scaling->dObjScale * scaling->dObjScale);
  resobj->dDualityGap = resobj->dPrimalObj - resobj->dDualObj;
  resobj->dRelObjGap =
      fabs(resobj->dPrimalObj - resobj->dDualObj) /
      (1.0 + fabs(resobj->dPrimalObj) + fabs(resobj->dDualObj));

  // resobj->dPrimalObjAverage /= scaling->dObjScale * scaling->dObjScale;
  // resobj->dDualObjAverage /= scaling->dObjScale * scaling->dObjScale;
  resobj->dDualityGapAverage =
      resobj->dPrimalObjAverage - resobj->dDualObjAverage;
  resobj->dRelObjGapAverage =
      fabs(resobj->dPrimalObjAverage - resobj->dDualObjAverage) /
      (1.0 + fabs(resobj->dPrimalObjAverage) + fabs(resobj->dDualObjAverage));

#if problem_USE_TIMERS
  problem->dComputeResidualsTime += getTimeStamp() - dStartTime;
#endif
}